

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O1

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::IsInHeap(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
           *this,void *address)

{
  bool bVar1;
  
  CCLock::Enter(&(this->criticalSection).super_CCLock);
  bVar1 = Memory::CustomHeap::
          Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::IsInHeap
                    (&this->allocationHeap,address);
  CCLock::Leave(&(this->criticalSection).super_CCLock);
  return bVar1;
}

Assistant:

bool EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::IsInHeap(__in void* address)
{
    AutoRealOrFakeCriticalSection<SyncObject> autocs(&this->criticalSection);
    return this->allocationHeap.IsInHeap(address);
}